

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midl.c
# Opt level: O0

int mdb_midl_append_range(MDB_IDL *idp,MDB_ID id,uint n)

{
  MDB_ID MVar1;
  int iVar2;
  MDB_ID len;
  MDB_ID *ids;
  MDB_ID MStack_20;
  uint n_local;
  MDB_ID id_local;
  MDB_IDL *idp_local;
  
  len = (MDB_ID)*idp;
  MVar1 = *(MDB_ID *)len;
  if (*(ulong *)(len + -8) < MVar1 + n) {
    iVar2 = mdb_midl_grow(idp,n | 0x1ffff);
    if (iVar2 != 0) {
      return 0xc;
    }
    len = (MDB_ID)*idp;
  }
  *(MDB_ID *)len = MVar1 + n;
  ids._4_4_ = n;
  MStack_20 = id;
  while (ids._4_4_ != 0) {
    *(MDB_ID *)(MVar1 * 8 + len + (ulong)ids._4_4_ * 8) = MStack_20;
    ids._4_4_ = ids._4_4_ - 1;
    MStack_20 = MStack_20 + 1;
  }
  return 0;
}

Assistant:

int mdb_midl_append_range( MDB_IDL *idp, MDB_ID id, unsigned n )
{
	MDB_ID *ids = *idp, len = ids[0];
	/* Too big? */
	if (len + n > ids[-1]) {
		if (mdb_midl_grow(idp, n | MDB_IDL_UM_MAX))
			return ENOMEM;
		ids = *idp;
	}
	ids[0] = len + n;
	ids += len;
	while (n)
		ids[n--] = id++;
	return 0;
}